

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_iterative_algorithm_info(Iterative_Method_parameters *parameters)

{
  char local_128 [8];
  char preconditioner_to_string [128];
  char method_to_string [128];
  uint BUFFER_SIZE;
  Iterative_Method_parameters *parameters_local;
  
  if (parameters->implementation == Implementation_Native) {
    if (parameters->method == Iterative_method_BiCGSTAB) {
      sprintf(preconditioner_to_string + 0x78,"BiCGSTAB");
    }
    else {
      sprintf(preconditioner_to_string + 0x78,"UNKNOWN");
    }
    if (parameters->preconditioner_type == Precond_Jacobi) {
      sprintf(local_128,"Jacobi");
    }
    else if (parameters->preconditioner_type == Precond_Null) {
      sprintf(local_128,"Null");
    }
    else {
      sprintf(local_128,"UNKNOWN");
    }
  }
  if (parameters->implementation == Implementation_Laspack) {
    if (parameters->method_laspack == CGNIter) {
      sprintf(preconditioner_to_string + 0x78,"CGN (Laspack)");
    }
    else if (parameters->method_laspack == CGSIter) {
      sprintf(preconditioner_to_string + 0x78,"CGS (Laspack)");
    }
    else if (parameters->method_laspack == BiCGSTABIter) {
      sprintf(preconditioner_to_string + 0x78,"BiCGStab (Laspack)");
    }
    else if (parameters->method_laspack == QMRIter) {
      sprintf(preconditioner_to_string + 0x78,"QMR (Laspack)");
    }
    else if (parameters->method_laspack == GMRESIter) {
      sprintf(preconditioner_to_string + 0x78,"GMRES (Laspack)");
    }
    else {
      sprintf(preconditioner_to_string + 0x78,"UNKNOWN (Laspack)");
    }
    if (parameters->preconditioner_type_laspack == JacobiPrecond) {
      sprintf(local_128,"Jacobi");
    }
    else if (parameters->preconditioner_type_laspack == SSORPrecond) {
      sprintf(local_128,"SSOR");
    }
    else {
      sprintf(local_128,"UNKNOWN");
    }
  }
  printf("Using %s iterative method with %s preconditioner\n",preconditioner_to_string + 0x78,
         local_128);
  return;
}

Assistant:

void print_iterative_algorithm_info (Iterative_Method_parameters const * parameters) {
  unsigned const BUFFER_SIZE = 128;
  char method_to_string[BUFFER_SIZE];
  char preconditioner_to_string[BUFFER_SIZE];

  if (parameters->implementation == Implementation_Native) {
    if (parameters->method == Iterative_method_BiCGSTAB) {
      sprintf (method_to_string, "BiCGSTAB");
    } else {
      /* nothing to do here */
      sprintf (method_to_string, "UNKNOWN");
    }

    if (parameters->preconditioner_type == Precond_Jacobi) {
      sprintf (preconditioner_to_string, "Jacobi");
    } else if (parameters->preconditioner_type == Precond_Null) {
      sprintf (preconditioner_to_string, "Null");
    } else {
      /* nothing to do here */
      sprintf (preconditioner_to_string, "UNKNOWN");
    }
  }

#ifndef NO_LASPACK
  if (parameters->implementation == Implementation_Laspack) {
    if (parameters->method_laspack == CGNIter) {
      sprintf (method_to_string, "CGN (Laspack)");
    } else if (parameters->method_laspack == CGSIter) {
      sprintf (method_to_string, "CGS (Laspack)");
    } else if (parameters->method_laspack == BiCGSTABIter) {
      sprintf (method_to_string, "BiCGStab (Laspack)");
    } else if (parameters->method_laspack == QMRIter) {
      sprintf (method_to_string, "QMR (Laspack)");
    } else if (parameters->method_laspack == GMRESIter) {
      sprintf (method_to_string, "GMRES (Laspack)");
    } else {
      /* nothing to do here */
      sprintf (method_to_string, "UNKNOWN (Laspack)");
    }

    if (parameters->preconditioner_type_laspack == JacobiPrecond) {
      sprintf (preconditioner_to_string, "Jacobi");
    } else if (parameters->preconditioner_type_laspack == SSORPrecond) {
      sprintf (preconditioner_to_string, "SSOR");
    } else {
      /* nothing to do here */
      sprintf (preconditioner_to_string, "UNKNOWN");
    }
  }
#endif /* NO_LASPACK */

#ifdef ALTERNATIVE_OUTPUT
  printf (FANCY_INFO "Method: %s.\n", method_to_string);
  printf (FANCY_INFO "Preconditioner: %s.\n", preconditioner_to_string);
  printf (FANCY_INFO "Relaxation constant: %lg.\n", parameters->relaxation_constant);
#else
  printf ("Using %s iterative method with %s preconditioner\n", 
          method_to_string, 
          preconditioner_to_string);
#endif /* ALTERNATIVE_OUTPUT */

  return;
}